

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O1

int xmlRelaxNGSchemaFacetCheck
              (void *data,xmlChar *type,xmlChar *facetname,xmlChar *val,xmlChar *strval,void *value)

{
  int iVar1;
  xmlSchemaTypePtr typeDecl;
  xmlSchemaFacetPtr facet;
  xmlSchemaTypeType xVar2;
  
  if (strval == (xmlChar *)0x0 || type == (xmlChar *)0x0) {
    return -1;
  }
  typeDecl = xmlSchemaGetPredefinedType(type,(xmlChar *)"http://www.w3.org/2001/XMLSchema");
  if (typeDecl == (xmlSchemaTypePtr)0x0) {
    return -1;
  }
  facet = xmlSchemaNewFacet();
  if (facet == (xmlSchemaFacetPtr)0x0) {
    return -1;
  }
  iVar1 = xmlStrEqual(facetname,(xmlChar *)"minInclusive");
  xVar2 = XML_SCHEMA_FACET_MININCLUSIVE;
  if (iVar1 == 0) {
    iVar1 = xmlStrEqual(facetname,(xmlChar *)"minExclusive");
    xVar2 = XML_SCHEMA_FACET_MINEXCLUSIVE;
    if (iVar1 == 0) {
      iVar1 = xmlStrEqual(facetname,(xmlChar *)"maxInclusive");
      xVar2 = XML_SCHEMA_FACET_MAXINCLUSIVE;
      if (iVar1 == 0) {
        iVar1 = xmlStrEqual(facetname,(xmlChar *)"maxExclusive");
        xVar2 = XML_SCHEMA_FACET_MAXEXCLUSIVE;
        if (iVar1 == 0) {
          iVar1 = xmlStrEqual(facetname,(xmlChar *)"totalDigits");
          xVar2 = XML_SCHEMA_FACET_TOTALDIGITS;
          if (iVar1 == 0) {
            iVar1 = xmlStrEqual(facetname,(xmlChar *)"fractionDigits");
            xVar2 = XML_SCHEMA_FACET_FRACTIONDIGITS;
            if (iVar1 == 0) {
              iVar1 = xmlStrEqual(facetname,"pattern");
              xVar2 = XML_SCHEMA_FACET_PATTERN;
              if (iVar1 == 0) {
                iVar1 = xmlStrEqual(facetname,"enumeration");
                xVar2 = XML_SCHEMA_FACET_ENUMERATION;
                if (iVar1 == 0) {
                  iVar1 = xmlStrEqual(facetname,(xmlChar *)"whiteSpace");
                  xVar2 = XML_SCHEMA_FACET_WHITESPACE;
                  if (iVar1 == 0) {
                    iVar1 = xmlStrEqual(facetname,"length");
                    xVar2 = XML_SCHEMA_FACET_LENGTH;
                    if (iVar1 == 0) {
                      iVar1 = xmlStrEqual(facetname,(xmlChar *)"maxLength");
                      xVar2 = XML_SCHEMA_FACET_MAXLENGTH;
                      if (iVar1 == 0) {
                        iVar1 = xmlStrEqual(facetname,(xmlChar *)"minLength");
                        xVar2 = XML_SCHEMA_FACET_MINLENGTH;
                        if (iVar1 == 0) goto LAB_0016f0ee;
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  facet->type = xVar2;
  facet->value = val;
  iVar1 = xmlSchemaCheckFacet(facet,typeDecl,(xmlSchemaParserCtxtPtr)0x0,type);
  if (iVar1 == 0) {
    iVar1 = xmlSchemaValidateFacet(typeDecl,facet,strval,(xmlSchemaValPtr)value);
    xmlSchemaFreeFacet(facet);
    return -(uint)(iVar1 != 0);
  }
LAB_0016f0ee:
  xmlSchemaFreeFacet(facet);
  return -1;
}

Assistant:

static int
xmlRelaxNGSchemaFacetCheck(void *data ATTRIBUTE_UNUSED,
                           const xmlChar * type, const xmlChar * facetname,
                           const xmlChar * val, const xmlChar * strval,
                           void *value)
{
    xmlSchemaFacetPtr facet;
    xmlSchemaTypePtr typ;
    int ret;

    if ((type == NULL) || (strval == NULL))
        return (-1);
    typ = xmlSchemaGetPredefinedType(type,
                                     BAD_CAST
                                     "http://www.w3.org/2001/XMLSchema");
    if (typ == NULL)
        return (-1);

    facet = xmlSchemaNewFacet();
    if (facet == NULL)
        return (-1);

    if (xmlStrEqual(facetname, BAD_CAST "minInclusive")) {
        facet->type = XML_SCHEMA_FACET_MININCLUSIVE;
    } else if (xmlStrEqual(facetname, BAD_CAST "minExclusive")) {
        facet->type = XML_SCHEMA_FACET_MINEXCLUSIVE;
    } else if (xmlStrEqual(facetname, BAD_CAST "maxInclusive")) {
        facet->type = XML_SCHEMA_FACET_MAXINCLUSIVE;
    } else if (xmlStrEqual(facetname, BAD_CAST "maxExclusive")) {
        facet->type = XML_SCHEMA_FACET_MAXEXCLUSIVE;
    } else if (xmlStrEqual(facetname, BAD_CAST "totalDigits")) {
        facet->type = XML_SCHEMA_FACET_TOTALDIGITS;
    } else if (xmlStrEqual(facetname, BAD_CAST "fractionDigits")) {
        facet->type = XML_SCHEMA_FACET_FRACTIONDIGITS;
    } else if (xmlStrEqual(facetname, BAD_CAST "pattern")) {
        facet->type = XML_SCHEMA_FACET_PATTERN;
    } else if (xmlStrEqual(facetname, BAD_CAST "enumeration")) {
        facet->type = XML_SCHEMA_FACET_ENUMERATION;
    } else if (xmlStrEqual(facetname, BAD_CAST "whiteSpace")) {
        facet->type = XML_SCHEMA_FACET_WHITESPACE;
    } else if (xmlStrEqual(facetname, BAD_CAST "length")) {
        facet->type = XML_SCHEMA_FACET_LENGTH;
    } else if (xmlStrEqual(facetname, BAD_CAST "maxLength")) {
        facet->type = XML_SCHEMA_FACET_MAXLENGTH;
    } else if (xmlStrEqual(facetname, BAD_CAST "minLength")) {
        facet->type = XML_SCHEMA_FACET_MINLENGTH;
    } else {
        xmlSchemaFreeFacet(facet);
        return (-1);
    }
    facet->value = val;
    ret = xmlSchemaCheckFacet(facet, typ, NULL, type);
    if (ret != 0) {
        xmlSchemaFreeFacet(facet);
        return (-1);
    }
    ret = xmlSchemaValidateFacet(typ, facet, strval, value);
    xmlSchemaFreeFacet(facet);
    if (ret != 0)
        return (-1);
    return (0);
}